

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

size_t __thiscall serial::Serial::readline(Serial *this,string *buffer,size_t size,string *eol)

{
  size_type sVar1;
  long lVar2;
  Serial *this_00;
  string *psVar3;
  __type _Var4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Serial *local_58;
  string *local_50;
  size_t local_48;
  string *local_40;
  ScopedReadLock local_38;
  ScopedReadLock lock;
  
  local_38.pimpl_ = this->pimpl_;
  sStack_80 = 0x1082ba;
  local_58 = this;
  local_40 = buffer;
  SerialImpl::readLock(local_38.pimpl_);
  sVar6 = 0;
  local_50 = eol;
  sVar1 = eol->_M_string_length;
  local_48 = size;
  lVar2 = -(size + 0xf & 0xfffffffffffffff0);
  uVar7 = (long)&local_78 + lVar2;
  while( true ) {
    this_00 = local_58;
    *(undefined8 *)((long)&sStack_80 + lVar2) = 1;
    sVar5 = *(size_t *)((long)&sStack_80 + lVar2);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1082f0;
    sVar5 = read_(this_00,(uint8_t *)(uVar7 + sVar6),sVar5);
    sVar6 = sVar6 + sVar5;
    if (sVar5 == 0) break;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x108310;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,(uVar7 + sVar6) - sVar1);
    psVar3 = local_50;
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10831c;
    _Var4 = std::operator==(&local_78,psVar3);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x108327;
    std::__cxx11::string::~string((string *)&local_78);
    if ((sVar6 == local_48) || (_Var4)) break;
  }
  psVar3 = local_40;
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x108341;
  std::__cxx11::string::append((char *)psVar3,uVar7);
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10834a;
  ScopedReadLock::~ScopedReadLock(&local_38);
  return sVar6;
}

Assistant:

size_t
Serial::readline (string &buffer, size_t size, string eol)
{
  ScopedReadLock lock(this->pimpl_);
  size_t eol_len = eol.length ();
  uint8_t *buffer_ = static_cast<uint8_t*>
                              (alloca (size * sizeof (uint8_t)));
  size_t read_so_far = 0;
  while (true)
  {
    size_t bytes_read = this->read_ (buffer_ + read_so_far, 1);
    read_so_far += bytes_read;
    if (bytes_read == 0) {
      break; // Timeout occured on reading 1 byte
    }
    if (string (reinterpret_cast<const char*>
         (buffer_ + read_so_far - eol_len), eol_len) == eol) {
      break; // EOL found
    }
    if (read_so_far == size) {
      break; // Reached the maximum read length
    }
  }
  buffer.append(reinterpret_cast<const char*> (buffer_), read_so_far);
  return read_so_far;
}